

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleScrollAdapter.cpp
# Opt level: O2

void __thiscall
cursespp::SimpleScrollAdapter::AddEntry
          (SimpleScrollAdapter *this,shared_ptr<cursespp::IScrollAdapter::IEntry> *entry)

{
  EntryList *this_00;
  element_type *peVar1;
  size_type sVar2;
  
  peVar1 = (entry->super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  (*peVar1->_vptr_IEntry[4])(peVar1,(this->super_ScrollAdapterBase).width);
  this_00 = &this->entries;
  std::
  deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  ::push_back(this_00,entry);
  while( true ) {
    sVar2 = std::
            deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
            ::size(this_00);
    if (sVar2 <= this->maxEntries) break;
    std::
    deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
    ::pop_front(this_00);
  }
  sigslot::signal1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>::operator()
            (&this->Changed,this);
  return;
}

Assistant:

void SimpleScrollAdapter::AddEntry(std::shared_ptr<IEntry> entry) {
    entry->SetWidth(this->GetWidth());
    entries.push_back(entry);

    while (entries.size() > this->maxEntries) {
        entries.pop_front();
    }

    this->Changed(this);
}